

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O1

void QGraphicsEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long in_FS_OFFSET;
  undefined1 local_39;
  void *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      if (*(long *)(*(long *)(_o + 8) + 0x78) != 0) {
        (**(code **)(**(long **)(*(long *)(*(long *)(_o + 8) + 0x78) + 8) + 0x58))();
      }
    }
    else if (_id == 1) {
      setEnabled((QGraphicsEffect *)_o,*_a[1]);
    }
    else if (_id == 0) {
      local_39 = *_a[1];
      puStack_30 = &local_39;
      local_38 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_38);
    }
    if (_c != ReadProperty) {
      if (_c != WriteProperty) {
        if (_c != IndexOfMethod) goto switchD_00399fd4_caseD_3;
        goto switchD_00399fd4_caseD_5;
      }
      goto switchD_00399fd4_caseD_2;
    }
    break;
  case ReadProperty:
    break;
  case WriteProperty:
switchD_00399fd4_caseD_2:
    if (_id != 0) goto switchD_00399fd4_caseD_3;
    goto LAB_0039a0a6;
  default:
    goto switchD_00399fd4_caseD_3;
  case IndexOfMethod:
switchD_00399fd4_caseD_5:
    if ((*_a[1] == enabledChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_00399fd4_caseD_3;
    }
    if (_c == WriteProperty) goto switchD_00399fd4_caseD_2;
    if (_c != ReadProperty) goto switchD_00399fd4_caseD_3;
  }
  if (_id == 0) {
    *(byte *)*_a = *(byte *)(*(long *)(_o + 8) + 0xa0) & 1;
  }
  if (_c == WriteProperty && _id == 0) {
LAB_0039a0a6:
    setEnabled((QGraphicsEffect *)_o,**_a);
  }
switchD_00399fd4_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->enabledChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->setEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->update(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsEffect::*)(bool )>(_a, &QGraphicsEffect::enabledChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}